

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O1

void __thiscall
anurbs::NurbsCurveGeometry<2L>::NurbsCurveGeometry
          (NurbsCurveGeometry<2L> *this,Index degree,Index nb_poles,bool is_rational)

{
  undefined8 *puVar1;
  Index size;
  long size_00;
  
  (this->super_CurveBase<2L>)._vptr_CurveBase = (_func_int **)&PTR__NurbsCurveGeometry_003848d8;
  this->m_degree = degree;
  size_00 = degree + nb_poles + -1;
  (this->m_knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  if (-1 < size_00) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots,size_00,size_00,1);
    (this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.m_storage.m_data
         = (double *)0x0;
    (this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.m_storage.m_rows
         = 0;
    if (nb_poles < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 2>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 2>]"
                   );
    }
    if (0x3fffffffffffffff < nb_poles) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = acos;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_2,_1>::resize
              ((DenseStorage<double,__1,__1,_2,_1> *)&this->m_poles,nb_poles * 2,nb_poles,2);
    size = 0;
    if (is_rational) {
      size = nb_poles;
    }
    (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    if (-1 < size) {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_weights,size,size,1);
      return;
    }
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                ,0x138,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

NurbsCurveGeometry(
        const Index degree,
        Index nb_poles,
        bool is_rational)
    : m_degree(degree)
    , m_poles(nb_poles, TDimension)
    , m_weights(is_rational ? nb_poles : 0)
    , m_knots(Nurbs::nb_knots(degree, nb_poles))
    {
        static_assert(TDimension > 0);
    }